

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall ImDrawList::PushTextureID(ImDrawList *this,ImTextureID texture_id)

{
  ImVector<void_*> *in_RSI;
  void **in_RDI;
  ImDrawList *unaff_retaddr;
  
  ImVector<void_*>::push_back(in_RSI,in_RDI);
  in_RDI[0x13] = in_RSI;
  _OnChangedTextureID(unaff_retaddr);
  return;
}

Assistant:

void ImDrawList::PushTextureID(ImTextureID texture_id)
{
    _TextureIdStack.push_back(texture_id);
    _CmdHeader.TextureId = texture_id;
    _OnChangedTextureID();
}